

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void waiter(EventCount *eventCount)

{
  ulong uVar1;
  ostream *poVar2;
  int i;
  int iVar3;
  
  for (iVar3 = 0; iVar3 != 100; iVar3 = iVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Preparing wait: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
    LOCK();
    uVar1 = (eventCount->val_).super___atomic_base<unsigned_long>._M_i;
    (eventCount->val_).super___atomic_base<unsigned_long>._M_i =
         (eventCount->val_).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    EventCount::wait(eventCount,(void *)(uVar1 >> 0x20));
    poVar2 = std::operator<<((ostream *)&std::cout,"Got notification: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return;
}

Assistant:

void waiter(EventCount *eventCount) {
    for (int i = 0; i < 100; i++) {
        std::cout << "Preparing wait: " << i << std::endl;
        auto key = eventCount->prepareWait();
        eventCount->wait(key);
        std::cout << "Got notification: " << i << std::endl;
    }
}